

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O1

void __thiscall asmjit::ConstPool::Tree::put(Tree *this,Node *newNode)

{
  size_t __n;
  uint uVar1;
  ulong uVar2;
  Node *pNVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  Node *pNVar7;
  Tree *pTVar8;
  Node *stack [64];
  long alStack_240 [66];
  
  __n = this->_dataSize;
  this->_length = this->_length + 1;
  if (this->_root == (Node *)0x0) {
    this->_root = newNode;
  }
  else {
    pNVar7 = this->_root;
    uVar6 = 0;
    do {
      pNVar3 = pNVar7;
      uVar5 = (int)uVar6 + 1;
      uVar4 = (ulong)uVar5;
      alStack_240[uVar6 + 1] = (long)pNVar3;
      alStack_240[0] = 0x1150a5;
      uVar1 = memcmp(pNVar3 + 1,newNode + 1,__n);
      uVar2 = (ulong)(uVar1 >> 0x1f);
      pNVar7 = pNVar3->_link[uVar2];
      uVar6 = uVar4;
    } while (pNVar3->_link[uVar2] != (Node *)0x0);
    pNVar3->_link[uVar2] = newNode;
    if (uVar5 != 0) {
      do {
        pNVar7 = (Node *)alStack_240[uVar4];
        if (uVar4 != 1) {
          uVar2 = (ulong)(*(Node **)(alStack_240[(ulong)((int)uVar4 - 2) + 1] + 8) == pNVar7);
        }
        pNVar3 = pNVar7->_link[0];
        uVar1 = *(uint *)&pNVar7->field_0x10 & 0x7fffffff;
        if ((pNVar3 != (Node *)0x0 && uVar1 != 0) &&
           ((*(uint *)&pNVar3->field_0x10 & 0x7fffffff) == uVar1)) {
          pNVar7->_link[0] = pNVar3->_link[1];
          pNVar3->_link[1] = pNVar7;
          pNVar7 = pNVar3;
        }
        pNVar3 = pNVar7->_link[1];
        uVar1 = *(uint *)&pNVar7->field_0x10 & 0x7fffffff;
        if (((pNVar3 != (Node *)0x0 && uVar1 != 0) && (pNVar3->_link[1] != (Node *)0x0)) &&
           ((*(uint *)&pNVar3->_link[1]->field_0x10 & 0x7fffffff) == uVar1)) {
          pNVar7->_link[1] = pNVar3->_link[0];
          pNVar3->_link[0] = pNVar7;
          *(uint *)&pNVar3->field_0x10 =
               *(uint *)&pNVar3->field_0x10 & 0x80000000 |
               *(uint *)&pNVar3->field_0x10 + 1 & 0x7fffffff;
          pNVar7 = pNVar3;
        }
        pTVar8 = this;
        if (uVar4 != 1) {
          pTVar8 = (Tree *)(uVar2 * 8 + alStack_240[(ulong)((int)uVar4 - 2) + 1]);
        }
        pTVar8->_root = pNVar7;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  return;
}

Assistant:

void ConstPool::Tree::put(ConstPool::Node* newNode) noexcept {
  size_t dataSize = _dataSize;
  _length++;

  if (!_root) {
    _root = newNode;
    return;
  }

  ConstPool::Node* node = _root;
  ConstPool::Node* stack[kHeightLimit];

  unsigned int top = 0;
  unsigned int dir;

  // Find a spot and save the stack.
  for (;;) {
    stack[top++] = node;
    dir = ::memcmp(node->getData(), newNode->getData(), dataSize) < 0;

    ConstPool::Node* link = node->_link[dir];
    if (!link) break;

    node = link;
  }

  // Link and rebalance.
  node->_link[dir] = newNode;

  while (top > 0) {
    // Which child?
    node = stack[--top];

    if (top != 0) {
      dir = stack[top - 1]->_link[1] == node;
    }

    node = ConstPoolTree_skewNode(node);
    node = ConstPoolTree_splitNode(node);

    // Fix the parent.
    if (top != 0)
      stack[top - 1]->_link[dir] = node;
    else
      _root = node;
  }
}